

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::NetState::InternalSerializeWithCachedSizesToArray
          (NetState *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  char *data;
  Type *pTVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar3;
  int index;
  int iVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,this->phase_,target);
  }
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,this->level_,target);
  }
  iVar4 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  index = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  this_00 = &this->stage_;
  for (; iVar4 != index; index = index + 1) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    data = (pTVar2->_M_dataplus)._M_p;
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar2->_M_string_length,SERIALIZE,"caffe.NetState.stage");
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,pTVar2,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = NetState::unknown_fields(this);
  puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* NetState::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1 [default = TEST];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 level = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->level(), target);
  }

  // repeated string stage = 3;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetState.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetState)
  return target;
}